

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmpp.c
# Opt level: O3

MPP_RET reset(Kmpp *ctx)

{
  MPP_RET MVar1;
  MPP_RET MVar2;
  
  if (ctx == (Kmpp *)0x0) {
    MVar2 = MPP_ERR_VALUE;
  }
  else {
    MVar2 = MPP_OK;
    if (ctx->mChanDup == 0) {
      if (ctx->mInitDone == 0) {
        MVar2 = MPP_ERR_INIT;
      }
      else {
        MVar1 = mpp_vcodec_ioctl(ctx->mClientFd,2,0,0,(void *)0x0);
        MVar2 = MPP_OK;
        if (MVar1 != MPP_OK) {
          _mpp_log_l(2,"kmpp","chan %d VCODEC_CHAN_RESET failed\n",(char *)0x0,
                     (ulong)(uint)ctx->mChanId);
          MVar2 = MVar1;
        }
      }
    }
  }
  return MVar2;
}

Assistant:

static MPP_RET reset(Kmpp *ctx)
{
    MPP_RET ret = MPP_OK;

    if (!ctx)
        return MPP_ERR_VALUE;
    if (ctx->mChanDup)
        return MPP_OK;
    if (!ctx->mInitDone)
        return MPP_ERR_INIT;

    ret = mpp_vcodec_ioctl(ctx->mClientFd, VCODEC_CHAN_RESET, 0, 0, 0);
    if (ret)
        mpp_err("chan %d VCODEC_CHAN_RESET failed\n", ctx->mChanId);

    return ret;
}